

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O0

Response * __thiscall
iqxmlrpc::Client_base::execute
          (Response *__return_storage_ptr__,Client_base *this,string *method,Param_list *pl,
          XHeaders *xheaders)

{
  Impl *pIVar1;
  Client_connection *pCVar2;
  undefined1 local_80 [8];
  Auto_conn conn;
  Request req;
  XHeaders *xheaders_local;
  Param_list *pl_local;
  string *method_local;
  Client_base *this_local;
  
  Request::Request((Request *)&conn.conn_ptr_,method,pl);
  pIVar1 = boost::scoped_ptr<iqxmlrpc::Client_base::Impl>::get(&this->impl_);
  Auto_conn::Auto_conn((Auto_conn *)local_80,pIVar1,this);
  pCVar2 = Auto_conn::operator->((Auto_conn *)local_80);
  pIVar1 = boost::scoped_ptr<iqxmlrpc::Client_base::Impl>::operator->(&this->impl_);
  Client_connection::set_options(pCVar2,&pIVar1->opts);
  pCVar2 = Auto_conn::operator->((Auto_conn *)local_80);
  Client_connection::process_session
            (__return_storage_ptr__,pCVar2,(Request *)&conn.conn_ptr_,xheaders);
  Auto_conn::~Auto_conn((Auto_conn *)local_80);
  Request::~Request((Request *)&conn.conn_ptr_);
  return __return_storage_ptr__;
}

Assistant:

Response Client_base::execute(
  const std::string& method, const Param_list& pl, const XHeaders& xheaders )
{
  Request req( method, pl );

  Auto_conn conn( *impl_.get(), *this );
  conn->set_options(impl_->opts);

  return conn->process_session( req, xheaders );
}